

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

size_t __thiscall shine::http::response::decode_header(response *this,int8 *data_,size_t len)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  entry_t entry;
  
  pcVar3 = strstr(data_,"\r\n\r\n");
  if ((pcVar3 != (char *)0x0) && (pcVar4 = strchr(data_,0x20), pcVar4 != (char *)0x0)) {
    std::__cxx11::string::assign((char *)this,(ulong)data_);
    pcVar5 = strchr(pcVar4 + 1,0x20);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      iVar2 = atoi(pcVar4 + 1);
      this->_status_code = (uint16)iVar2;
      pcVar4 = strstr(pcVar5 + 1,"\r\n");
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&this->_status_desc,(ulong)(pcVar5 + 1));
        pcVar4 = pcVar4 + 2;
        do {
          if (pcVar3 + 2 <= pcVar4) {
            return len;
          }
          entry._key.super_string._M_dataplus._M_p = (pointer)&entry._key.super_string.field_2;
          entry._key.super_string._M_string_length = 0;
          entry._key.super_string.field_2._M_local_buf[0] = '\0';
          entry._value.super_string._M_dataplus._M_p = (pointer)&entry._value.super_string.field_2;
          entry._value.super_string._M_string_length = 0;
          entry._value.super_string.field_2._M_local_buf[0] = '\0';
          pcVar5 = strstr(pcVar4,": ");
          if (pcVar5 != (char *)0x0) {
            std::__cxx11::string::assign((char *)&entry,(ulong)pcVar4);
            pcVar4 = strstr(pcVar5 + 2,"\r\n");
            std::__cxx11::string::assign((char *)&entry._value,(ulong)(pcVar5 + 2));
            pcVar4 = pcVar4 + 2;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&entry,"Content-Length");
            if (bVar1) {
              sVar6 = atoll(entry._value.super_string._M_dataplus._M_p);
              (this->super_header)._content_length = sVar6;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&entry,"Transfer-Encoding");
              if ((bVar1) && (bVar1 = std::operator==(&entry._value.super_string,"chunked"), bVar1))
              {
                this->_is_chunk = true;
              }
              else {
                std::vector<shine::http::entry_t,std::allocator<shine::http::entry_t>>::
                emplace_back<shine::http::entry_t&>
                          ((vector<shine::http::entry_t,std::allocator<shine::http::entry_t>> *)
                           &(this->super_header)._entrys,&entry);
              }
            }
          }
          entry_t::~entry_t(&entry);
        } while (pcVar5 != (char *)0x0);
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t decode_header(const int8 *data_, size_t len)
            {
                int8 *data = (int8*)data_;
                int8 *header_end = strstr(data, "\r\n\r\n");
                if (header_end == NULL)
                    return -1;

                //decode version status code status desc
                int8 *tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                get_version().assign(data, tmp - data);
                data = tmp + 1;

                tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                *tmp = '\0';
                get_status_code() = atoi(data);
                data = tmp + 1;

                tmp = strstr(data, "\r\n");
                if (tmp == NULL)
                    return -1;

                get_status_desc().assign(data, tmp - data);
                data = tmp + 2;

                //decode other entrys
                while (data < header_end + 2)
                {
                    entry_t entry;
                    tmp = strstr(data, ": ");
                    if (tmp == NULL)
                        return -1;

                    entry.get_key().assign(data, tmp - data);
                    data = tmp + 2;

                    tmp = strstr(data, "\r\n");
                    entry.get_value().assign(data, tmp - data);
                    data = tmp + 2;

					if (entry.get_key() == "Content-Length")
						get_content_length() = entry.get_value().to_uint64();
					else if (entry.get_key() == "Transfer-Encoding" && entry.get_value() == "chunked")
						set_is_chunk(true);
                    else
                        add_entry(std::move(entry));
                }

                return len;
            }